

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segapcm.c
# Opt level: O3

void device_stop_segapcm(void *chip)

{
  free(*(void **)((long)chip + 0x28));
  *(undefined8 *)((long)chip + 0x28) = 0;
  free(*(void **)((long)chip + 8));
  free(chip);
  return;
}

Assistant:

void device_stop_segapcm(void *chip)
{
	segapcm_state *spcm = (segapcm_state *)chip;
	free(spcm->rom);	spcm->rom = NULL;
#ifdef _DEBUG
	//sega_pcm_fwrite_romusage(spcm);
	free(spcm->romusage);
#endif
	free(spcm->ram);
	free(spcm);
	
	return;
}